

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetCompileFeaturesCommand::HandleDirectContent
          (cmTargetCompileFeaturesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  cmMakefile *this_00;
  bool bVar1;
  reference feature;
  undefined1 local_60 [8];
  string error;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  const_iterator it;
  bool param_4_local;
  bool param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  cmTargetCompileFeaturesCommand *this_local;
  
  it._M_current._6_1_ = param_4;
  it._M_current._7_1_ = param_3;
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(content);
  while( true ) {
    error.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(content);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&error.field_2 + 8));
    if (!bVar1) break;
    std::__cxx11::string::string((string *)local_60);
    this_00 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
    feature = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_38);
    bVar1 = cmMakefile::AddRequiredTargetFeature(this_00,tgt,feature,(string *)local_60);
    if (!bVar1) {
      cmCommand::SetError((cmCommand *)this,(string *)local_60);
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_60);
    if (!bVar1) goto LAB_00626d27;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_38);
  }
  this_local._7_1_ = 1;
LAB_00626d27:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTargetCompileFeaturesCommand::HandleDirectContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool, bool)
{
  for (std::vector<std::string>::const_iterator it = content.begin();
       it != content.end(); ++it) {
    std::string error;
    if (!this->Makefile->AddRequiredTargetFeature(tgt, *it, &error)) {
      this->SetError(error);
      return false;
    }
  }
  return true;
}